

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::SetNotNullInfo::Deserialize(SetNotNullInfo *this,Deserializer *deserializer)

{
  uint uVar1;
  SetNotNullInfo *this_00;
  pointer pSVar2;
  pointer *__ptr;
  unique_ptr<duckdb::SetNotNullInfo,_std::default_delete<duckdb::SetNotNullInfo>,_true> result;
  _Head_base<0UL,_duckdb::SetNotNullInfo_*,_false> local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (SetNotNullInfo *)operator_new(0x98);
  SetNotNullInfo(this_00);
  local_58._M_head_impl = this_00;
  pSVar2 = unique_ptr<duckdb::SetNotNullInfo,_std::default_delete<duckdb::SetNotNullInfo>,_true>::
           operator->((unique_ptr<duckdb::SetNotNullInfo,_std::default_delete<duckdb::SetNotNullInfo>,_true>
                       *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,400,"column_name");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pSVar2->column_name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010c1731;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pSVar2->column_name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010c1731;
  }
  operator_delete(local_50);
LAB_010c1731:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> SetNotNullInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SetNotNullInfo>(new SetNotNullInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "column_name", result->column_name);
	return std::move(result);
}